

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

reference __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::at
          (span<int,_18446744073709551615UL> *this,size_type idx)

{
  bool bVar1;
  size_type sVar2;
  pointer piVar3;
  size_type idx_local;
  span<int,_18446744073709551615UL> *this_local;
  
  bVar1 = detail::is_positive<unsigned_long>(idx);
  if ((!bVar1) || (sVar2 = size(this), sVar2 <= idx)) {
    sVar2 = size(this);
    detail::throw_out_of_range(idx,sVar2);
  }
  piVar3 = data(this);
  return piVar3 + idx;
}

Assistant:

span_constexpr14 reference at( size_type idx ) const
    {
#if span_CONFIG( NO_EXCEPTIONS )
        return this->operator[]( idx );
#else
        if ( !detail::is_positive( idx ) || size() <= idx )
        {
            detail::throw_out_of_range( idx, size() );
        }
        return *( data() + idx );
#endif
    }